

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O0

void Ga2_ManRestart(Ga2_Man_t *p)

{
  long lVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  sat_solver2 *psVar4;
  lit local_1c;
  Vec_Int_t *pVStack_18;
  int Lit;
  Vec_Int_t *vToAdd;
  Ga2_Man_t *p_local;
  
  local_1c = 1;
  vToAdd = (Vec_Int_t *)p;
  if ((p->pGia == (Gia_Man_t *)0x0) || (p->pGia->vGateClasses == (Vec_Int_t *)0x0)) {
    __assert_fail("p->pGia != NULL && p->pGia->vGateClasses != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/abs/absGla.c"
                  ,0x45c,"void Ga2_ManRestart(Ga2_Man_t *)");
  }
  pGVar3 = Gia_ManPi(p->pGia,0);
  if (-1 < *(long *)pGVar3) {
    __assert_fail("Gia_ManPi(p->pGia, 0)->fPhase",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/abs/absGla.c"
                  ,0x45d,"void Ga2_ManRestart(Ga2_Man_t *)");
  }
  lVar1._0_4_ = vToAdd[6].nCap;
  lVar1._4_4_ = vToAdd[6].nSize;
  if (lVar1 != 0) {
    sat_solver2_delete(*(sat_solver2 **)(vToAdd + 6));
  }
  psVar4 = sat_solver2_new();
  *(sat_solver2 **)(vToAdd + 6) = psVar4;
  *(int *)(*(long *)(vToAdd + 6) + 0x54) = vToAdd->pArray[5];
  *(int *)(*(long *)(vToAdd + 6) + 0x58) = vToAdd->pArray[6];
  *(int *)(*(long *)(vToAdd + 6) + 0x5c) = vToAdd->pArray[7];
  *(undefined4 *)(*(long *)(vToAdd + 6) + 0x50) = *(undefined4 *)(*(long *)(vToAdd + 6) + 0x54);
  sat_solver2_addclause(*(sat_solver2 **)(vToAdd + 6),&local_1c,(lit *)&stack0xffffffffffffffe8,-1);
  Ga2_ManShrinkAbs((Ga2_Man_t *)vToAdd,1,1,1);
  pVStack_18 = Ga2_ManAbsDerive(*(Gia_Man_t **)vToAdd);
  if (*(long *)(*(long *)(vToAdd + 6) + 0x1e8) == 0) {
    if (vToAdd->pArray[0x1e] < 0) {
      Ga2_ManAddToAbs((Ga2_Man_t *)vToAdd,pVStack_18);
      Vec_IntFree(pVStack_18);
      iVar2 = Vec_IntSize((Vec_Int_t *)vToAdd[2].pArray);
      *(int *)((long)&vToAdd[3].pArray + 4) = iVar2;
      iVar2 = Vec_IntSize(*(Vec_Int_t **)(vToAdd + 3));
      vToAdd[4].nCap = iVar2;
      if (vToAdd->pArray[8] != 0) {
        sat_solver2_set_runtime_limit
                  (*(sat_solver2 **)(vToAdd + 6),
                   (long)vToAdd->pArray[8] * 1000000 + *(long *)(vToAdd + 0xb));
      }
      memset(vToAdd[7].pArray,0,(long)vToAdd[8].nCap * 0x18);
      return;
    }
    __assert_fail("p->pPars->iFrame < 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/abs/absGla.c"
                  ,0x46c,"void Ga2_ManRestart(Ga2_Man_t *)");
  }
  __assert_fail("p->pSat->pPrf2 == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/abs/absGla.c"
                ,0x46b,"void Ga2_ManRestart(Ga2_Man_t *)");
}

Assistant:

void Ga2_ManRestart( Ga2_Man_t * p )
{
    Vec_Int_t * vToAdd;
    int Lit = 1;
    assert( p->pGia != NULL && p->pGia->vGateClasses != NULL );
    assert( Gia_ManPi(p->pGia, 0)->fPhase ); // marks are set
    // clear SAT variable numbers (begin with 1)
    if ( p->pSat ) sat_solver2_delete( p->pSat );
    p->pSat      = sat_solver2_new();
    p->pSat->nLearntStart = p->pPars->nLearnedStart;
    p->pSat->nLearntDelta = p->pPars->nLearnedDelta;
    p->pSat->nLearntRatio = p->pPars->nLearnedPerce;
    p->pSat->nLearntMax   = p->pSat->nLearntStart;
    // add clause x0 = 0  (lit0 = 1; lit1 = 0)
    sat_solver2_addclause( p->pSat, &Lit, &Lit + 1, -1 );
    // remove previous abstraction
    Ga2_ManShrinkAbs( p, 1, 1, 1 );
    // start new abstraction
    vToAdd = Ga2_ManAbsDerive( p->pGia );
    assert( p->pSat->pPrf2 == NULL );
    assert( p->pPars->iFrame < 0 );
    Ga2_ManAddToAbs( p, vToAdd );
    Vec_IntFree( vToAdd );
    p->LimAbs = Vec_IntSize(p->vAbs);
    p->LimPpi = Vec_IntSize(p->vValues);
    // set runtime limit
    if ( p->pPars->nTimeOut )
        sat_solver2_set_runtime_limit( p->pSat, p->pPars->nTimeOut * CLOCKS_PER_SEC + p->timeStart );
    // clean the hash table
    memset( p->pTable, 0, 6 * sizeof(int) * p->nTable );
}